

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseReader.cpp
# Opt level: O1

void __thiscall
license::FullLicenseInfo::FullLicenseInfo
          (FullLicenseInfo *this,string *source,string *product,string *license_signature)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  
  (this->license_signature)._M_dataplus._M_p = (pointer)&(this->license_signature).field_2;
  pcVar2 = (license_signature->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar2,pcVar2 + license_signature->_M_string_length);
  (this->source)._M_dataplus._M_p = (pointer)&(this->source).field_2;
  pcVar2 = (source->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->source,pcVar2,pcVar2 + source->_M_string_length);
  (this->m_project)._M_dataplus._M_p = (pointer)&(this->m_project).field_2;
  pcVar2 = (product->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_project,pcVar2,pcVar2 + product->_M_string_length);
  this->m_magic = 0;
  p_Var1 = &(this->m_limits)._M_t._M_impl.super__Rb_tree_header;
  (this->m_limits)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_limits)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_limits)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_limits)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_limits)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

FullLicenseInfo::FullLicenseInfo(const string &source, const string &product, const string &license_signature)
	: source(source),
	  m_project(product),  //
	  license_signature(license_signature),
	  m_magic(0) {}